

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O2

int xmlHashRemoveEntry3(xmlHashTablePtr table,xmlChar *name,xmlChar *name2,xmlChar *name3,
                       xmlHashDeallocator f)

{
  _xmlHashEntry *p_Var1;
  xmlChar *pxVar2;
  xmlChar *pxVar3;
  xmlChar *pxVar4;
  undefined8 uVar5;
  int iVar6;
  unsigned_long uVar7;
  _xmlHashEntry *p_Var8;
  _xmlHashEntry *p_Var9;
  
  if (name != (xmlChar *)0x0 && table != (xmlHashTablePtr)0x0) {
    uVar7 = xmlHashComputeKey(table,name,name2,name3);
    if (table->table[uVar7].valid != 0) {
      p_Var1 = table->table + uVar7;
      p_Var9 = (_xmlHashEntry *)0x0;
      while (p_Var8 = p_Var1, p_Var8 != (_xmlHashEntry *)0x0) {
        iVar6 = xmlStrEqual(p_Var8->name,name);
        if (((iVar6 != 0) && (iVar6 = xmlStrEqual(p_Var8->name2,name2), iVar6 != 0)) &&
           (iVar6 = xmlStrEqual(p_Var8->name3,name3), iVar6 != 0)) {
          if ((f != (xmlHashDeallocator)0x0) && (p_Var8->payload != (void *)0x0)) {
            (*f)(p_Var8->payload,p_Var8->name);
          }
          p_Var8->payload = (void *)0x0;
          if (table->dict == (xmlDictPtr)0x0) {
            if (p_Var8->name != (xmlChar *)0x0) {
              (*xmlFree)(p_Var8->name);
            }
            if (p_Var8->name2 != (xmlChar *)0x0) {
              (*xmlFree)(p_Var8->name2);
            }
            if (p_Var8->name3 != (xmlChar *)0x0) {
              (*xmlFree)(p_Var8->name3);
            }
          }
          p_Var1 = p_Var8->next;
          if (p_Var9 == (_xmlHashEntry *)0x0) {
            if (p_Var1 == (_xmlHashEntry *)0x0) {
              p_Var8->valid = 0;
            }
            else {
              p_Var9 = table->table;
              p_Var8 = p_Var1->next;
              pxVar2 = p_Var1->name;
              pxVar3 = p_Var1->name2;
              pxVar4 = p_Var1->name3;
              uVar5 = *(undefined8 *)&p_Var1->valid;
              p_Var9[uVar7].payload = p_Var1->payload;
              (&p_Var9[uVar7].payload)[1] = (void *)uVar5;
              p_Var9[uVar7].name2 = pxVar3;
              (&p_Var9[uVar7].name2)[1] = pxVar4;
              p_Var9[uVar7].next = p_Var8;
              p_Var9[uVar7].name = pxVar2;
              (*xmlFree)(p_Var1);
            }
          }
          else {
            p_Var9->next = p_Var1;
            (*xmlFree)(p_Var8);
          }
          table->nbElems = table->nbElems + -1;
          return 0;
        }
        p_Var9 = p_Var8;
        p_Var1 = p_Var8->next;
      }
    }
  }
  return -1;
}

Assistant:

int
xmlHashRemoveEntry3(xmlHashTablePtr table, const xmlChar *name,
    const xmlChar *name2, const xmlChar *name3, xmlHashDeallocator f) {
    unsigned long key;
    xmlHashEntryPtr entry;
    xmlHashEntryPtr prev = NULL;

    if (table == NULL || name == NULL)
        return(-1);

    key = xmlHashComputeKey(table, name, name2, name3);
    if (table->table[key].valid == 0) {
        return(-1);
    } else {
        for (entry = &(table->table[key]); entry != NULL; entry = entry->next) {
            if (xmlStrEqual(entry->name, name) &&
                    xmlStrEqual(entry->name2, name2) &&
                    xmlStrEqual(entry->name3, name3)) {
                if ((f != NULL) && (entry->payload != NULL))
                    f(entry->payload, entry->name);
                entry->payload = NULL;
		if (table->dict == NULL) {
		    if(entry->name)
			xmlFree(entry->name);
		    if(entry->name2)
			xmlFree(entry->name2);
		    if(entry->name3)
			xmlFree(entry->name3);
		}
                if(prev) {
                    prev->next = entry->next;
		    xmlFree(entry);
		} else {
		    if (entry->next == NULL) {
			entry->valid = 0;
		    } else {
			entry = entry->next;
			memcpy(&(table->table[key]), entry, sizeof(xmlHashEntry));
			xmlFree(entry);
		    }
		}
                table->nbElems--;
                return(0);
            }
            prev = entry;
        }
        return(-1);
    }
}